

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall
LruHash<IPAsKeyLRU>::LruMoveToMostRecent(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool stored)

{
  IPAsKeyLRU *pIVar1;
  
  if (key != (IPAsKeyLRU *)0x0) {
    if (!stored) {
      LruUnlink(this,key);
    }
    pIVar1 = this->MostRecentlyUsed;
    key->LessRecentKey = pIVar1;
    if (pIVar1 != (IPAsKeyLRU *)0x0) {
      pIVar1->MoreRecentKey = key;
    }
    this->MostRecentlyUsed = key;
    if (this->LeastRecentlyUsed == (IPAsKeyLRU *)0x0) {
      this->LeastRecentlyUsed = key;
    }
  }
  return;
}

Assistant:

void LruMoveToMostRecent(KeyObj * key, bool stored)
    {
        if (key != NULL)
        {
            if (!stored)
            {
                LruUnlink(key);
            }
            key->LessRecentKey = MostRecentlyUsed;
            if (MostRecentlyUsed != NULL)
            {
                MostRecentlyUsed->MoreRecentKey = key;
            }
            MostRecentlyUsed = key;

            if (LeastRecentlyUsed == NULL)
            {
                LeastRecentlyUsed = key;
            }
        }
    }